

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.h
# Opt level: O0

DGBBlock * __thiscall
dg::llvmdg::SystemDependenceGraph::getBBlock(SystemDependenceGraph *this,BasicBlock *b)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator it;
  map<const_llvm::BasicBlock_*,_dg::sdg::DGBBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
  *in_stack_ffffffffffffffc8;
  DGBBlock *local_30;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::BasicBlock_*,_dg::sdg::DGBBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x140299);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::BasicBlock_*,_dg::sdg::DGBBlock_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    local_30 = (DGBBlock *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>
                           *)0x1402dc);
    local_30 = ppVar2->second;
  }
  return local_30;
}

Assistant:

sdg::DGBBlock *getBBlock(const llvm::BasicBlock *b) const {
        auto it = _blk_mapping.find(b);
        return it == _blk_mapping.end() ? nullptr : it->second;
    }